

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O0

void __thiscall TasgridWrapper::loadComputedValues(TasgridWrapper *this)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> local_a0;
  undefined1 local_88 [8];
  Data2D<double> x;
  vector<double,_std::allocator<double>_> local_50;
  undefined1 local_38 [8];
  Data2D<double> v;
  TasgridWrapper *this_local;
  
  v.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  verifiedRead((Data2D<double> *)local_38,this,&this->valsfilename,this->num_outputs);
  if (this->command == command_loadvalues) {
    TasGrid::Data2D<double>::release(&local_50,(Data2D<double> *)local_38);
    TasGrid::TasmanianSparseGrid::loadNeededValues((vector *)this);
    std::vector<double,_std::allocator<double>_>::~vector(&local_50);
  }
  else {
    bVar1 = TasGrid::TasmanianSparseGrid::isUsingConstruction(&this->grid);
    if (!bVar1) {
      TasGrid::TasmanianSparseGrid::beginConstruction();
    }
    verifiedRead((Data2D<double> *)local_88,this,&this->xfilename,this->num_dimensions);
    TasGrid::Data2D<double>::release(&local_a0,(Data2D<double> *)local_88);
    TasGrid::Data2D<double>::release(&local_b8,(Data2D<double> *)local_38);
    TasGrid::TasmanianSparseGrid::loadConstructedPoints((vector *)this,(vector *)&local_a0);
    std::vector<double,_std::allocator<double>_>::~vector(&local_b8);
    std::vector<double,_std::allocator<double>_>::~vector(&local_a0);
    TasGrid::Data2D<double>::~Data2D((Data2D<double> *)local_88);
  }
  TasGrid::Data2D<double>::~Data2D((Data2D<double> *)local_38);
  return;
}

Assistant:

void TasgridWrapper::loadComputedValues(){
    auto v = verifiedRead(valsfilename, num_outputs);
    if (command == command_loadvalues){
        grid.loadNeededValues(v.release());
    }else{
        if (not grid.isUsingConstruction())
            grid.beginConstruction();
        auto x = verifiedRead(xfilename, num_dimensions);
        grid.loadConstructedPoints(x.release(), v.release());
    }
}